

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

MessageBuilder * __thiscall el::base::MessageBuilder::operator<<(MessageBuilder *this,wchar_t *msg)

{
  bool bVar1;
  stringstream_t *psVar2;
  char *__ptr;
  element_type *this_00;
  char *buff_;
  wchar_t *msg_local;
  MessageBuilder *this_local;
  
  if (msg == (wchar_t *)0x0) {
    psVar2 = Logger::stream_abi_cxx11_(this->m_logger);
    std::operator<<((ostream *)(psVar2 + 0x10),consts::kNullPointer);
  }
  else {
    __ptr = utils::Str::wcharPtrToCharPtr(msg);
    psVar2 = Logger::stream_abi_cxx11_(this->m_logger);
    std::operator<<((ostream *)(psVar2 + 0x10),__ptr);
    free(__ptr);
    this_00 = std::__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)elStorage);
    bVar1 = Storage::hasFlag(this_00,AutoSpacing);
    if (bVar1) {
      psVar2 = Logger::stream_abi_cxx11_(this->m_logger);
      std::operator<<((ostream *)(psVar2 + 0x10)," ");
    }
  }
  return this;
}

Assistant:

MessageBuilder& MessageBuilder::operator<<(const wchar_t* msg) {
  if (msg == nullptr) {
    m_logger->stream() << base::consts::kNullPointer;
    return *this;
  }
#  if defined(ELPP_UNICODE)
  m_logger->stream() << msg;
#  else
  char* buff_ = base::utils::Str::wcharPtrToCharPtr(msg);
  m_logger->stream() << buff_;
  free(buff_);
#  endif
  if (ELPP->hasFlag(LoggingFlag::AutoSpacing)) {
    m_logger->stream() << " ";
  }
  return *this;
}